

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

bool check_protection(GlobalVars *gv,char *name)

{
  int iVar1;
  SymNames *pSVar2;
  
  pSVar2 = (SymNames *)&gv->prot_syms;
  do {
    pSVar2 = pSVar2->next;
    if (pSVar2 == (SymNames *)0x0) {
      return 0;
    }
    iVar1 = strcmp(pSVar2->name,name);
  } while (iVar1 != 0);
  return 1;
}

Assistant:

bool check_protection(struct GlobalVars *gv,const char *name)
/* checks if symbol name is protected against stripping */
{
  struct SymNames *sn = gv->prot_syms;

  while (sn) {
    if (!strcmp(sn->name,name))
      return TRUE;
    sn = sn->next;
  }
  return FALSE;
}